

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimAnim.cpp
# Opt level: O0

void simanim::createAnimation(path *path,uint64_t frameWidth,uint64_t frameHeight)

{
  bool bVar1;
  ostream *poVar2;
  path local_270;
  path local_248;
  ofstream local_220 [8];
  ofstream file;
  uint64_t frameHeight_local;
  uint64_t frameWidth_local;
  path *path_local;
  
  bVar1 = std::filesystem::exists(path);
  if (!bVar1) {
    std::filesystem::create_directories(path);
  }
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_270,(char (*) [9])"time.txt",auto_format);
  std::filesystem::__cxx11::operator/(&local_248,path,&local_270);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_220,&local_248,_S_out);
  std::filesystem::__cxx11::path::~path(&local_248);
  std::filesystem::__cxx11::path::~path(&local_270);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_220,frameWidth);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,frameHeight);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void createAnimation(const fs::path& path, uint64_t frameWidth, uint64_t frameHeight)
	{
		if (!fs::exists(path))
			fs::create_directories(path);

		std::ofstream file(path / "time.txt");
		file << frameWidth << " " << frameHeight << std::endl;
		file.close();
	}